

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O0

void noir_mode(dw_rom *rom)

{
  uint8_t *pal_end;
  uint8_t *pal_start;
  dw_rom *rom_local;
  
  if ((rom->flags[0xb] & 0x30) != 0) {
    noir_replace(rom->content + 0x1a2e,rom->content + 0x1c83);
    noir_replace(rom->content + 0xbdf4,rom->content + 0xbdf7);
    noir_replace(rom->content + 0xbe02,rom->content + 0xbe0b);
  }
  return;
}

Assistant:

static void noir_mode(dw_rom *rom)
{
    if (!NOIR_MODE(rom))
        return;

    uint8_t *pal_start, *pal_end;

    pal_start = &rom->content[0x1a2e];
    pal_end   = &rom->content[0x1c8e];

//     noir_replace(&rom->content[0x1a2e], &rom->content[0x1c8e]);
    noir_replace(&rom->content[0x1a2e], &rom->content[0x1c83]); // omit DL
    noir_replace(&rom->content[0xbdf4], &rom->content[0xbdf7]);
    noir_replace(&rom->content[0xbe02], &rom->content[0xbe0b]);
//     noir_replace(&rom->content[0xefab], &rom->content[0xefb6]); // DL
//     noir_replace(&rom->content[0x3d41], &rom->content[0x3d4c]); // DL
}